

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void ClearShrink<std::vector<bool,std::allocator<bool>>>(vector<bool,_std::allocator<bool>_> *v)

{
  _Bvector_impl *p_Var1;
  long in_FS_OFFSET;
  _Bvector_base<std::allocator<bool>_> local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  p_Var1 = &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl;
  local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       (p_Var1->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset;
  local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ =
       *(undefined4 *)
        &(p_Var1->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc;
  local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p;
  p_Var1 = &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl;
  local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       (p_Var1->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ =
       *(undefined4 *)
        &(p_Var1->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc;
  (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
  (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ClearShrink(V& v) noexcept
{
    // There are various ways to clear a vector and release its memory:
    //
    // 1. V{}.swap(v)
    // 2. v = V{}
    // 3. v = {}; v.shrink_to_fit();
    // 4. v.clear(); v.shrink_to_fit();
    //
    // (2) does not appear to release memory in glibc debug mode, even if v.shrink_to_fit()
    // follows. (3) and (4) rely on std::vector::shrink_to_fit, which is only a non-binding
    // request. Therefore, we use method (1).

    V{}.swap(v);
}